

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
fmt::v5::
format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::on_format_specs(format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  *this,iterator it)

{
  size_t *psVar1;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
  *pbVar2;
  type tVar3;
  char *pcVar4;
  long lVar5;
  type tVar7;
  null_terminating_iterator<char> it_00;
  null_terminating_iterator<char> nVar8;
  iterator iVar9;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
  handler;
  basic_format_specs<char> specs;
  arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> local_80;
  format_specs *local_60;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
  *local_58;
  type local_50;
  format_specs local_48;
  char *pcVar6;
  
  pcVar6 = (this->context).
           super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
           .parse_context_.format_str_.data_;
  lVar5 = (long)it.ptr_ - (long)pcVar6;
  if (-1 < lVar5) {
    (this->context).
    super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
    .parse_context_.format_str_.data_ = pcVar6 + lVar5;
    psVar1 = &(this->context).
              super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
              .parse_context_.format_str_.size_;
    *psVar1 = *psVar1 - lVar5;
    pbVar2 = &this->context;
    tVar3 = (this->arg).type_;
    if (tVar3 == custom_type) {
      (*(this->arg).value_.field_0.custom.format)((this->arg).value_.field_0.pointer,pbVar2);
      pcVar6 = (this->context).
               super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
               .parse_context_.format_str_.data_;
      nVar8.end_ = pcVar6 + (this->context).
                            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                            .parse_context_.format_str_.size_;
      nVar8.ptr_ = pcVar6;
    }
    else {
      if (tVar3 == named_arg_type) {
        __assert_fail("(false) && \"invalid argument type\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/fireice-uk[P]gulps/fmt/format.h"
                      ,0x4d2,
                      "typename internal::result_of<Visitor (int)>::type fmt::visit(Visitor &&, basic_format_arg<Context>) [Visitor = fmt::internal::custom_formatter<char, fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<char>>, char>>, Context = fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<char>>, char>]"
                     );
      }
      local_48.super_align_spec.width_ = 0;
      local_48.super_align_spec.fill_ = L' ';
      local_48.super_align_spec.align_ = ALIGN_DEFAULT;
      local_48.flags_ = 0;
      local_48.precision_ = -1;
      local_48.type_ = '\0';
      local_50 = (this->arg).type_;
      it_00.end_ = (char *)&local_60;
      it_00.ptr_ = it.end_;
      local_60 = &local_48;
      local_58 = pbVar2;
      nVar8 = internal::
              parse_format_specs<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                        ((internal *)it.ptr_,it_00,
                         (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
                          *)(ulong)local_50);
      pcVar6 = nVar8.ptr_;
      if ((pcVar6 == nVar8.end_) || (*pcVar6 != '}')) {
        internal::error_handler::on_error((error_handler *)this,"missing \'}\' in format string");
      }
      pcVar4 = (pbVar2->
               super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
               ).parse_context_.format_str_.data_;
      lVar5 = (long)pcVar6 - (long)pcVar4;
      if (lVar5 < 0) goto LAB_0011f0b9;
      (this->context).
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
      .parse_context_.format_str_.data_ = pcVar4 + lVar5;
      psVar1 = &(this->context).
                super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                .parse_context_.format_str_.size_;
      *psVar1 = *psVar1 - lVar5;
      local_80.
      super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>.
      writer_.out_.container =
           (this->context).
           super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
           .out_.container;
      local_80.
      super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>.
      writer_.locale_._M_t.
      super___uniq_ptr_impl<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>_>
      ._M_t.
      super__Tuple_impl<0UL,_fmt::v5::locale_provider_*,_std::default_delete<fmt::v5::locale_provider>_>
      .super__Head_base<0UL,_fmt::v5::locale_provider_*,_false>._M_head_impl =
           (__uniq_ptr_data<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>,_true,_true>
            )(__uniq_ptr_impl<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>_>
              )0x0;
      local_80.
      super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>.
      specs_ = &local_48;
      local_80.ctx_ = pbVar2;
      tVar7 = visit<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                        (&local_80,this->arg);
      (this->context).
      super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
      .out_.container = tVar7.container;
      if ((_Head_base<0UL,_fmt::v5::locale_provider_*,_false>)
          local_80.
          super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
          .writer_.locale_._M_t.
          super___uniq_ptr_impl<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>_>
          ._M_t.
          super__Tuple_impl<0UL,_fmt::v5::locale_provider_*,_std::default_delete<fmt::v5::locale_provider>_>
          .super__Head_base<0UL,_fmt::v5::locale_provider_*,_false>._M_head_impl !=
          (_Head_base<0UL,_fmt::v5::locale_provider_*,_false>)0x0) {
        (*(*(_func_int ***)
            local_80.
            super_arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
            .writer_.locale_._M_t.
            super___uniq_ptr_impl<fmt::v5::locale_provider,_std::default_delete<fmt::v5::locale_provider>_>
            ._M_t.
            super__Tuple_impl<0UL,_fmt::v5::locale_provider_*,_std::default_delete<fmt::v5::locale_provider>_>
            .super__Head_base<0UL,_fmt::v5::locale_provider_*,_false>._M_head_impl)[1])();
      }
    }
    iVar9.ptr_ = nVar8.ptr_;
    iVar9.end_ = nVar8.end_;
    return iVar9;
  }
LAB_0011f0b9:
  __assert_fail("(value >= 0) && \"negative value\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fireice-uk[P]gulps/fmt/core.h"
                ,0xde,
                "typename std::make_unsigned<Int>::type fmt::internal::to_unsigned(Int) [Int = long]"
               );
}

Assistant:

fp(uint64_t f, int e): f(f), e(e) {}